

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  float *pfVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_b4;
  long local_b0;
  float *local_a8;
  float *local_a0;
  float *local_88;
  float *local_80;
  
  iVar1 = this->kCategoryCount;
  if (0 < (long)iVar1) {
    uVar2 = this->kStateCount;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->kPatternCount;
    iVar5 = this->kMatrixSize;
    local_b0 = 0;
    uVar8 = uVar2 + 1;
    uVar6 = uVar2 + 3;
    if (-1 < (int)uVar2) {
      uVar6 = uVar2;
    }
    local_b4 = iVar3 * startPattern;
    local_80 = matrices2 + 2;
    local_88 = matrices1 + 2;
    local_a8 = matrices1;
    local_a0 = matrices2;
    do {
      if (startPattern < endPattern) {
        pfVar16 = partials2 + local_b4;
        pfVar7 = partials1 + local_b4;
        pfVar11 = destP + (iVar4 * (int)local_b0 + startPattern) * iVar3;
        iVar12 = startPattern;
        do {
          if (0 < (int)uVar2) {
            uVar17 = 0;
            pfVar9 = local_a8;
            pfVar10 = local_80;
            pfVar13 = local_88;
            pfVar14 = local_a0;
            do {
              auVar19 = ZEXT816(0) << 0x40;
              uVar15 = 0;
              if (3 < (int)uVar2) {
                do {
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = *(ulong *)(pfVar13 + (uVar15 - 2));
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *(ulong *)(pfVar7 + uVar15);
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = *(ulong *)(pfVar13 + uVar15);
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = *(ulong *)(pfVar7 + uVar15 + 2);
                  auVar20 = vmovhps_avx(auVar20,*(undefined8 *)(pfVar10 + (uVar15 - 2)));
                  auVar24 = vmovhps_avx(auVar24,*(undefined8 *)(pfVar16 + uVar15));
                  auVar24 = vfmadd213ps_fma(auVar24,auVar20,auVar19);
                  auVar19 = vmovhps_avx(auVar22,*(undefined8 *)(pfVar10 + uVar15));
                  auVar20 = vmovhps_avx(auVar25,*(undefined8 *)(pfVar16 + uVar15 + 2));
                  uVar15 = uVar15 + 4;
                  auVar19 = vfmadd213ps_fma(auVar20,auVar19,auVar24);
                } while ((long)uVar15 < (long)(int)(uVar6 & 0xfffffffc));
              }
              auVar20 = vshufpd_avx(auVar19,auVar19,1);
              auVar21 = ZEXT1664(auVar20);
              auVar23 = ZEXT1664(auVar19);
              if ((int)uVar15 < (int)uVar2) {
                uVar15 = uVar15 & 0xffffffff;
                lVar18 = 0;
                do {
                  auVar20 = vfmadd231ss_fma(auVar23._0_16_,ZEXT416((uint)pfVar9[uVar15 + lVar18]),
                                            ZEXT416((uint)pfVar7[uVar15 + lVar18]));
                  auVar23 = ZEXT1664(auVar20);
                  auVar20 = vfmadd231ss_fma(auVar21._0_16_,ZEXT416((uint)pfVar14[uVar15 + lVar18]),
                                            ZEXT416((uint)pfVar16[uVar15 + lVar18]));
                  auVar21 = ZEXT1664(auVar20);
                  lVar18 = lVar18 + 1;
                } while (uVar2 - uVar15 != lVar18);
              }
              auVar20 = vmovshdup_avx(auVar19);
              auVar19 = vshufps_avx(auVar19,auVar19,0xff);
              uVar17 = uVar17 + 1;
              pfVar10 = pfVar10 + uVar8;
              pfVar13 = pfVar13 + uVar8;
              pfVar14 = pfVar14 + uVar8;
              pfVar9 = pfVar9 + uVar8;
              *pfVar11 = (auVar20._0_4_ + auVar23._0_4_) * (auVar19._0_4_ + auVar21._0_4_);
              pfVar11 = pfVar11 + 1;
            } while (uVar17 != uVar2);
          }
          iVar12 = iVar12 + 1;
          pfVar16 = pfVar16 + iVar3;
          pfVar7 = pfVar7 + iVar3;
        } while (iVar12 != endPattern);
      }
      local_b4 = local_b4 + iVar4 * iVar3;
      local_80 = local_80 + iVar5;
      local_88 = local_88 + iVar5;
      local_a0 = local_a0 + iVar5;
      local_a8 = local_a8 + iVar5;
      local_b0 = local_b0 + 1;
    } while (local_b0 != iVar1);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}